

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O3

string * __thiscall
libtorrent::aux::to_hex_abi_cxx11_(string *__return_storage_ptr__,aux *this,span<const_char> in)

{
  pointer pcVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (in.m_ptr != (char *)0x0) {
    ::std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)in.m_ptr * '\x02');
    if (0 < (int)(uint)in.m_ptr) {
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      uVar2 = 0;
      do {
        pcVar1[uVar2 * 2] = "0123456789abcdef"[(byte)this[uVar2] >> 4];
        pcVar1[uVar2 * 2 + 1] = "0123456789abcdef"[(byte)this[uVar2] & 0xf];
        uVar2 = uVar2 + 1;
      } while (((uint)in.m_ptr & 0x7fffffff) != uVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_hex(span<char const> in)
	{
		std::string ret;
		if (!in.empty())
		{
			ret.resize(std::size_t(in.size() * 2));
			to_hex(in.data(), int(in.size()), &ret[0]);
		}
		return ret;
	}